

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_reg_t new_temp_reg(MIR_context_t ctx,MIR_type_t type,MIR_func_t func)

{
  MIR_error_func_t p_Var1;
  MIR_reg_t MVar2;
  reg_desc_t *prVar3;
  char *pcVar4;
  uint32_t uVar5;
  MIR_func_t func_00;
  MIR_func_t func_01;
  MIR_func_t func_02;
  char *ctx_00;
  long lVar6;
  MIR_context_t ctx_01;
  char reg_name [30];
  
  if ((2 < type - MIR_T_F) && (type != MIR_T_I64)) {
    p_Var1 = ctx->error_func;
    pcVar4 = type_str(ctx,type);
    ctx_00 = "wrong type %s for temporary register";
    lVar6 = 0x11;
    (*p_Var1)(MIR_reg_type_error,"wrong type %s for temporary register",pcVar4);
    prVar3 = find_rd_by_name((MIR_context_t)ctx_00,(char *)func_01->internal,func_01);
    if (prVar3 == (reg_desc_t *)0x0) {
      MVar2 = 0x1aff78;
      ctx_01 = (MIR_context_t)0xf;
      (**(code **)(lVar6 + 0x10))(0xf,"undeclared func reg %s",ctx_00);
      prVar3 = find_rd_by_reg(ctx_01,MVar2,func_02);
      return prVar3->type;
    }
    return prVar3->reg;
  }
  if (func != (MIR_func_t)0x0) {
    while (uVar5 = func->last_temp_num + 1, func->last_temp_num = uVar5, uVar5 != 0) {
      sprintf(&stack0xffffffffffffffa8,"%s%d","t");
      prVar3 = find_rd_by_name((MIR_context_t)&stack0xffffffffffffffa8,(char *)func->internal,
                               func_00);
      if (prVar3 == (reg_desc_t *)0x0) {
        MVar2 = new_func_reg(ctx,func,type,&stack0xffffffffffffffa8,(char *)0x0);
        return MVar2;
      }
    }
    (*ctx->error_func)(MIR_unique_reg_error,"out of unique regs");
  }
  __assert_fail("func != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x948,"MIR_reg_t new_temp_reg(MIR_context_t, MIR_type_t, MIR_func_t)");
}

Assistant:

static MIR_reg_t new_temp_reg (MIR_context_t ctx, MIR_type_t type, MIR_func_t func) {
  char reg_name[30];

  if (type != MIR_T_I64 && type != MIR_T_F && type != MIR_T_D && type != MIR_T_LD)
    MIR_get_error_func (ctx) (MIR_reg_type_error, "wrong type %s for temporary register",
                              type_str (ctx, type));
  mir_assert (func != NULL);
  for (;;) {
    func->last_temp_num++;
    if (func->last_temp_num == 0)
      MIR_get_error_func (ctx) (MIR_unique_reg_error, "out of unique regs");
    sprintf (reg_name, "%s%d", TEMP_REG_NAME_PREFIX, func->last_temp_num);

    if (find_rd_by_name (ctx, reg_name, func) == NULL)
      return MIR_new_func_reg (ctx, func, type, reg_name);
  }
}